

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Bad.c
# Opt level: O1

DdNode * Llb_BddComputeBad(Aig_Man_t *pInit,DdManager *dd,abctime TimeOut)

{
  void *pvVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  DdNode *pDVar5;
  Vec_Ptr_t *__ptr;
  DdNode *f;
  long lVar6;
  long lVar7;
  
  iVar3 = Cudd_ReadSize(dd);
  if (iVar3 != pInit->nObjs[2]) {
    __assert_fail("Cudd_ReadSize(dd) == Aig_ManCiNum(pInit)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Bad.c"
                  ,0x33,"DdNode *Llb_BddComputeBad(Aig_Man_t *, DdManager *, abctime)");
  }
  pDVar5 = Cudd_ReadOne(dd);
  (pInit->pConst1->field_5).pData = pDVar5;
  if (0 < pInit->nRegs) {
    iVar3 = 0;
    do {
      uVar4 = pInit->nTruePis + iVar3;
      if (((int)uVar4 < 0) || (pInit->vCis->nSize <= (int)uVar4)) goto LAB_007cf166;
      pvVar1 = pInit->vCis->pArray[uVar4];
      pDVar5 = Cudd_bddIthVar(dd,iVar3);
      *(DdNode **)((long)pvVar1 + 0x28) = pDVar5;
      iVar3 = iVar3 + 1;
    } while (iVar3 < pInit->nRegs);
  }
  if (0 < pInit->nTruePis) {
    lVar6 = 0;
    do {
      if (pInit->vCis->nSize <= lVar6) goto LAB_007cf166;
      pvVar1 = pInit->vCis->pArray[lVar6];
      pDVar5 = Cudd_bddIthVar(dd,pInit->nRegs + (int)lVar6);
      *(DdNode **)((long)pvVar1 + 0x28) = pDVar5;
      lVar6 = lVar6 + 1;
    } while (lVar6 < pInit->nTruePis);
  }
  __ptr = Aig_ManDfsNodes(pInit,(Aig_Obj_t **)pInit->vCos->pArray,pInit->nTruePos);
  if (__ptr->nSize < 1) {
LAB_007cf01b:
    pDVar5 = Cudd_ReadLogicZero(dd);
    Cudd_Ref(pDVar5);
    if (0 < pInit->nTruePos) {
      lVar6 = 0;
      f = pDVar5;
      do {
        if (pInit->vCos->nSize <= lVar6) goto LAB_007cf166;
        uVar2 = *(ulong *)((long)pInit->vCos->pArray[lVar6] + 8);
        pDVar5 = Cudd_bddOr(dd,f,(DdNode *)
                                 ((ulong)((uint)uVar2 & 1) ^
                                 *(ulong *)((uVar2 & 0xfffffffffffffffe) + 0x28)));
        Cudd_Ref(pDVar5);
        Cudd_RecursiveDeref(dd,f);
        lVar6 = lVar6 + 1;
        f = pDVar5;
      } while (lVar6 < pInit->nTruePos);
    }
    if (0 < __ptr->nSize) {
      lVar6 = 0;
      do {
        if (0xfffffffd < (*(uint *)((long)__ptr->pArray[lVar6] + 0x18) & 7) - 7) {
          Cudd_RecursiveDeref(dd,*(DdNode **)((long)__ptr->pArray[lVar6] + 0x28));
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < __ptr->nSize);
    }
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (void **)0x0;
    }
    if (__ptr != (Vec_Ptr_t *)0x0) {
      free(__ptr);
    }
    Cudd_Deref(pDVar5);
    return pDVar5;
  }
  lVar6 = 0;
LAB_007cefb7:
  pvVar1 = __ptr->pArray[lVar6];
  if (0xfffffffd < (*(uint *)((long)pvVar1 + 0x18) & 7) - 7) {
    pDVar5 = Cudd_bddAnd(dd,(DdNode *)
                            ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^
                            *(ulong *)((*(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe) + 0x28)),
                         (DdNode *)
                         ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^
                         *(ulong *)((*(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe) + 0x28)))
    ;
    *(DdNode **)((long)pvVar1 + 0x28) = pDVar5;
    if (pDVar5 == (DdNode *)0x0) {
      if (lVar6 == 0) goto LAB_007cf12e;
      lVar7 = 0;
      while (lVar7 < __ptr->nSize) {
        pDVar5 = *(DdNode **)((long)__ptr->pArray[lVar7] + 0x28);
        if (pDVar5 != (DdNode *)0x0) {
          Cudd_RecursiveDeref(dd,pDVar5);
        }
        lVar7 = lVar7 + 1;
        if (lVar6 == lVar7) {
LAB_007cf12e:
          if (__ptr->pArray != (void **)0x0) {
            free(__ptr->pArray);
            __ptr->pArray = (void **)0x0;
          }
          if (__ptr != (Vec_Ptr_t *)0x0) {
            free(__ptr);
          }
          return (DdNode *)0x0;
        }
      }
LAB_007cf166:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    Cudd_Ref(pDVar5);
  }
  lVar6 = lVar6 + 1;
  if (__ptr->nSize <= lVar6) goto LAB_007cf01b;
  goto LAB_007cefb7;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////
 
/**Function*************************************************************

  Synopsis    [Computes bad in working manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
DdNode * Llb_BddComputeBad( Aig_Man_t * pInit, DdManager * dd, abctime TimeOut )
{
    Vec_Ptr_t * vNodes;
    DdNode * bBdd0, * bBdd1, * bTemp, * bResult;
    Aig_Obj_t * pObj;
    int i, k;
    assert( Cudd_ReadSize(dd) == Aig_ManCiNum(pInit) );
    // initialize elementary variables
    Aig_ManConst1(pInit)->pData = Cudd_ReadOne( dd );
    Saig_ManForEachLo( pInit, pObj, i )
        pObj->pData = Cudd_bddIthVar( dd, i );
    Saig_ManForEachPi( pInit, pObj, i )
        pObj->pData = Cudd_bddIthVar( dd, Aig_ManRegNum(pInit) + i );
    // compute internal nodes
    vNodes = Aig_ManDfsNodes( pInit, (Aig_Obj_t **)Vec_PtrArray(pInit->vCos), Saig_ManPoNum(pInit) );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) )
            continue;
        bBdd0 = Cudd_NotCond( (DdNode *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        bBdd1 = Cudd_NotCond( (DdNode *)Aig_ObjFanin1(pObj)->pData, Aig_ObjFaninC1(pObj) );
//        pObj->pData = Extra_bddAndTime( dd, bBdd0, bBdd1, TimeOut );
        pObj->pData = Cudd_bddAnd( dd, bBdd0, bBdd1 );
        if ( pObj->pData == NULL )
        {
            Vec_PtrForEachEntryStop( Aig_Obj_t *, vNodes, pObj, k, i )
                if ( pObj->pData )
                    Cudd_RecursiveDeref( dd, (DdNode *)pObj->pData );
            Vec_PtrFree( vNodes );
            return NULL;
        }
        Cudd_Ref( (DdNode *)pObj->pData );
    }
    // quantify PIs of each PO
    bResult = Cudd_ReadLogicZero( dd );  Cudd_Ref( bResult );
    Saig_ManForEachPo( pInit, pObj, i )
    {
        bBdd0   = Cudd_NotCond( Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        bResult = Cudd_bddOr( dd, bTemp = bResult, bBdd0 );     Cudd_Ref( bResult );
        Cudd_RecursiveDeref( dd, bTemp );
    }
    // deref
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) )
            continue;
        Cudd_RecursiveDeref( dd, (DdNode *)pObj->pData );
    }
    Vec_PtrFree( vNodes );
    Cudd_Deref( bResult );
    return bResult;
}